

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::XmlUnitTestResultPrinter::PrintXmlUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  UnitTestImpl *pUVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  TestSuite *pTVar5;
  TimeInMillis ms;
  TimeInMillis ms_00;
  int i;
  int i_00;
  string kTestsuites;
  allocator local_85;
  int local_84;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"testsuites",(allocator *)&local_80);
  std::operator<<(stream,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
  poVar4 = std::operator<<(stream,"<");
  std::operator<<(poVar4,(string *)&local_40);
  std::__cxx11::string::string((string *)&local_80,"tests",&local_85);
  local_84 = UnitTest::reportable_test_count(unit_test);
  StreamableToString<int>(&local_60,&local_84);
  OutputXmlAttribute(stream,&local_40,&local_80,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_80,"failures",&local_85);
  local_84 = UnitTest::failed_test_count(unit_test);
  StreamableToString<int>(&local_60,&local_84);
  OutputXmlAttribute(stream,&local_40,&local_80,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_80,"disabled",&local_85);
  local_84 = UnitTest::reportable_disabled_test_count(unit_test);
  StreamableToString<int>(&local_60,&local_84);
  OutputXmlAttribute(stream,&local_40,&local_80,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_80,"errors",(allocator *)&local_84);
  std::__cxx11::string::string((string *)&local_60,"0",&local_85);
  OutputXmlAttribute(stream,&local_40,&local_80,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_80,"time",(allocator *)&local_84);
  FormatTimeInMillisAsSeconds_abi_cxx11_(&local_60,(internal *)unit_test->impl_->elapsed_time_,ms);
  OutputXmlAttribute(stream,&local_40,&local_80,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_80,"timestamp",(allocator *)&local_84);
  FormatEpochTimeInMillisAsIso8601_abi_cxx11_
            (&local_60,(internal *)unit_test->impl_->start_timestamp_,ms_00);
  OutputXmlAttribute(stream,&local_40,&local_80,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  if (FLAGS_gtest_shuffle == '\x01') {
    std::__cxx11::string::string((string *)&local_80,"random_seed",&local_85);
    local_84 = unit_test->impl_->random_seed_;
    StreamableToString<int>(&local_60,&local_84);
    OutputXmlAttribute(stream,&local_40,&local_80,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  std::__cxx11::string::string((string *)&local_80,"name",(allocator *)&local_84);
  std::__cxx11::string::string((string *)&local_60,"AllTests",&local_85);
  OutputXmlAttribute(stream,&local_40,&local_80,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::operator<<(stream,">\n");
  pUVar1 = unit_test->impl_;
  std::__cxx11::string::string((string *)&local_80,"  ",(allocator *)&local_60);
  OutputXmlTestProperties(stream,&pUVar1->ad_hoc_test_result_,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  for (i_00 = 0; pUVar1 = unit_test->impl_,
      i_00 < (int)((ulong)((long)(pUVar1->test_suites_).
                                 super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pUVar1->test_suites_).
                                super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3); i_00 = i_00 + 1) {
    pTVar5 = UnitTest::GetTestSuite(unit_test,i_00);
    iVar3 = TestSuite::reportable_test_count(pTVar5);
    if (0 < iVar3) {
      pTVar5 = UnitTest::GetTestSuite(unit_test,i_00);
      PrintXmlTestSuite(stream,pTVar5);
    }
  }
  bVar2 = TestResult::Failed(&pUVar1->ad_hoc_test_result_);
  if (bVar2) {
    OutputXmlTestSuiteForTestResult(stream,&unit_test->impl_->ad_hoc_test_result_);
  }
  poVar4 = std::operator<<(stream,"</");
  poVar4 = std::operator<<(poVar4,(string *)&local_40);
  std::operator<<(poVar4,">\n");
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlUnitTest(std::ostream* stream,
                                                const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";

  *stream << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n";
  *stream << "<" << kTestsuites;

  OutputXmlAttribute(stream, kTestsuites, "tests",
                     StreamableToString(unit_test.reportable_test_count()));
  OutputXmlAttribute(stream, kTestsuites, "failures",
                     StreamableToString(unit_test.failed_test_count()));
  OutputXmlAttribute(
      stream, kTestsuites, "disabled",
      StreamableToString(unit_test.reportable_disabled_test_count()));
  OutputXmlAttribute(stream, kTestsuites, "errors", "0");
  OutputXmlAttribute(stream, kTestsuites, "time",
                     FormatTimeInMillisAsSeconds(unit_test.elapsed_time()));
  OutputXmlAttribute(
      stream, kTestsuites, "timestamp",
      FormatEpochTimeInMillisAsIso8601(unit_test.start_timestamp()));

  if (GTEST_FLAG_GET(shuffle)) {
    OutputXmlAttribute(stream, kTestsuites, "random_seed",
                       StreamableToString(unit_test.random_seed()));
  }

  OutputXmlAttribute(stream, kTestsuites, "name", "AllTests");
  *stream << ">\n";

  OutputXmlTestProperties(stream, unit_test.ad_hoc_test_result(),
                          /*indent=*/"  ");
  for (int i = 0; i < unit_test.total_test_suite_count(); ++i) {
    if (unit_test.GetTestSuite(i)->reportable_test_count() > 0)
      PrintXmlTestSuite(stream, *unit_test.GetTestSuite(i));
  }

  // If there was a test failure outside of one of the test suites (like in a
  // test environment) include that in the output.
  if (unit_test.ad_hoc_test_result().Failed()) {
    OutputXmlTestSuiteForTestResult(stream, unit_test.ad_hoc_test_result());
  }

  *stream << "</" << kTestsuites << ">\n";
}